

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickle_row.c
# Opt level: O3

void PickleRows_delete(PickleRows *pickle_rows)

{
  PickleCells *pickle_cells;
  wchar_t wVar1;
  PickleRow *__ptr;
  long lVar2;
  
  if (pickle_rows != (PickleRows *)0x0) {
    __ptr = pickle_rows->pickle_rows;
    if (__ptr != (PickleRow *)0x0) {
      wVar1 = pickle_rows->row_count;
      if (L'\0' < wVar1) {
        lVar2 = 0;
        do {
          pickle_cells = (PickleCells *)pickle_rows->pickle_rows[lVar2].pickle_cells;
          if (pickle_cells != (PickleCells *)0x0) {
            PickleCells_delete(pickle_cells);
            wVar1 = pickle_rows->row_count;
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 < wVar1);
        __ptr = pickle_rows->pickle_rows;
      }
      free(__ptr);
    }
    free(pickle_rows);
    return;
  }
  return;
}

Assistant:

void PickleRows_delete(const PickleRows* pickle_rows) {
    if (!pickle_rows) {
        return;
    }
    if (pickle_rows->pickle_rows) {
        int i;
        for(i = 0; i < pickle_rows->row_count; ++i) {
            delete_pickle_row_content(pickle_rows->pickle_rows + i);
        }
        free((void*)pickle_rows->pickle_rows);
    }
    free((void*)pickle_rows);
}